

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply_property_reader.h
# Opt level: O0

void __thiscall draco::PlyPropertyReader<float>::~PlyPropertyReader(PlyPropertyReader<float> *this)

{
  std::function<float_(int)>::~function((function<float_(int)> *)0x12c9c2);
  return;
}

Assistant:

explicit PlyPropertyReader(const PlyProperty *property)
      : property_(property) {
    // Find the suitable function for converting values.
    switch (property->data_type()) {
      case DT_UINT8:
        convert_value_func_ = [=](int val_id) {
          return this->ConvertValue<uint8_t>(val_id);
        };
        break;
      case DT_INT8:
        convert_value_func_ = [=](int val_id) {
          return this->ConvertValue<int8_t>(val_id);
        };
        break;
      case DT_UINT16:
        convert_value_func_ = [=](int val_id) {
          return this->ConvertValue<uint16_t>(val_id);
        };
        break;
      case DT_INT16:
        convert_value_func_ = [=](int val_id) {
          return this->ConvertValue<int16_t>(val_id);
        };
        break;
      case DT_UINT32:
        convert_value_func_ = [=](int val_id) {
          return this->ConvertValue<uint32_t>(val_id);
        };
        break;
      case DT_INT32:
        convert_value_func_ = [=](int val_id) {
          return this->ConvertValue<int32_t>(val_id);
        };
        break;
      case DT_FLOAT32:
        convert_value_func_ = [=](int val_id) {
          return this->ConvertValue<float>(val_id);
        };
        break;
      case DT_FLOAT64:
        convert_value_func_ = [=](int val_id) {
          return this->ConvertValue<double>(val_id);
        };
        break;
      default:
        break;
    }
  }